

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaAttDefList.cpp
# Opt level: O2

XMLAttDef * __thiscall
xercesc_4_0::SchemaAttDefList::getAttDef(SchemaAttDefList *this,XMLSize_t index)

{
  ArrayIndexOutOfBoundsException *this_00;
  
  if (index < this->fCount) {
    return &this->fArray[index]->super_XMLAttDef;
  }
  this_00 = (ArrayIndexOutOfBoundsException *)__cxa_allocate_exception(0x30);
  ArrayIndexOutOfBoundsException::ArrayIndexOutOfBoundsException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/SchemaAttDefList.cpp"
             ,0x7d,AttrList_BadIndex,(this->super_XMLAttDefList).fMemoryManager);
  __cxa_throw(this_00,&ArrayIndexOutOfBoundsException::typeinfo,XMLException::~XMLException);
}

Assistant:

XMLAttDef &SchemaAttDefList::getAttDef(XMLSize_t index)
{
    if(index >= fCount)
        ThrowXMLwithMemMgr(ArrayIndexOutOfBoundsException, XMLExcepts::AttrList_BadIndex, getMemoryManager());
    return *(fArray[index]);
}